

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86_fma::forward
          (Eltwise_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  uint uVar4;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  long lVar9;
  pointer pMVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  pointer pMVar14;
  int q;
  float *pfVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [32];
  int iVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar29 [32];
  undefined1 auVar33 [32];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar22 = (ulong)uVar4;
  uVar11 = m->h * m->w * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar20 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var5 = this->_vptr_Eltwise_x86_fma;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) == 0) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar4) {
        uVar12 = 0;
        do {
          pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
          pfVar15 = (float *)(pMVar10[1].cstep * uVar12 * pMVar10[1].elemsize +
                             (long)pMVar10[1].data);
          pauVar17 = (undefined1 (*) [32])
                     (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar11 < 8) {
            uVar21 = 0;
          }
          else {
            iVar20 = 7;
            do {
              auVar6._4_4_ = pfVar15[1] * pfVar13[1];
              auVar6._0_4_ = *pfVar15 * *pfVar13;
              auVar6._8_4_ = pfVar15[2] * pfVar13[2];
              auVar6._12_4_ = pfVar15[3] * pfVar13[3];
              auVar6._16_4_ = pfVar15[4] * pfVar13[4];
              auVar6._20_4_ = pfVar15[5] * pfVar13[5];
              auVar6._24_4_ = pfVar15[6] * pfVar13[6];
              auVar6._28_4_ = pfVar15[7];
              *pauVar17 = auVar6;
              pfVar13 = pfVar13 + 8;
              pfVar15 = pfVar15 + 8;
              pauVar17 = pauVar17 + 1;
              iVar20 = iVar20 + 8;
              uVar21 = uVar11 & 0xfffffff8;
            } while (iVar20 < (int)uVar11);
          }
          uVar8 = uVar21 | 3;
          while ((int)uVar8 < (int)uVar11) {
            auVar23._0_4_ = *pfVar15 * *pfVar13;
            auVar23._4_4_ = pfVar15[1] * pfVar13[1];
            auVar23._8_4_ = pfVar15[2] * pfVar13[2];
            auVar23._12_4_ = pfVar15[3] * pfVar13[3];
            *(undefined1 (*) [16])*pauVar17 = auVar23;
            pfVar13 = pfVar13 + 4;
            pfVar15 = pfVar15 + 4;
            pauVar17 = (undefined1 (*) [32])((long)*pauVar17 + 0x10);
            uVar8 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
            lVar9 = 0;
            do {
              *(float *)((long)*pauVar17 + lVar9 * 4) = pfVar15[lVar9] * pfVar13[lVar9];
              lVar9 = lVar9 + 1;
            } while (uVar11 - uVar21 != (int)lVar9);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar22);
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (2 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7)) {
        uVar12 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar10 = pMVar10 + uVar12;
            uVar16 = 0;
            do {
              pfVar13 = (float *)(pMVar10->cstep * uVar16 * pMVar10->elemsize + (long)pMVar10->data)
              ;
              pauVar17 = (undefined1 (*) [32])
                         (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
              uVar21 = 0;
              if (7 < (int)uVar11) {
                iVar20 = 7;
                do {
                  auVar7._4_4_ = pfVar13[1] * *(float *)((long)*pauVar17 + 4);
                  auVar7._0_4_ = *pfVar13 * *(float *)*pauVar17;
                  auVar7._8_4_ = pfVar13[2] * *(float *)((long)*pauVar17 + 8);
                  auVar7._12_4_ = pfVar13[3] * *(float *)((long)*pauVar17 + 0xc);
                  auVar7._16_4_ = pfVar13[4] * *(float *)((long)*pauVar17 + 0x10);
                  auVar7._20_4_ = pfVar13[5] * *(float *)((long)*pauVar17 + 0x14);
                  auVar7._24_4_ = pfVar13[6] * *(float *)((long)*pauVar17 + 0x18);
                  auVar7._28_4_ = pfVar13[7];
                  *pauVar17 = auVar7;
                  pfVar13 = pfVar13 + 8;
                  pauVar17 = pauVar17 + 1;
                  iVar20 = iVar20 + 8;
                  uVar21 = uVar11 & 0xfffffff8;
                } while (iVar20 < (int)uVar11);
              }
              uVar8 = uVar21 | 3;
              while ((int)uVar8 < (int)uVar11) {
                auVar24._0_4_ = *pfVar13 * *(float *)*pauVar17;
                auVar24._4_4_ = pfVar13[1] * *(float *)((long)*pauVar17 + 4);
                auVar24._8_4_ = pfVar13[2] * *(float *)((long)*pauVar17 + 8);
                auVar24._12_4_ = pfVar13[3] * *(float *)((long)*pauVar17 + 0xc);
                *(undefined1 (*) [16])*pauVar17 = auVar24;
                pfVar13 = pfVar13 + 4;
                pauVar17 = (undefined1 (*) [32])((long)*pauVar17 + 0x10);
                uVar8 = uVar21 + 7;
                uVar21 = uVar21 + 4;
              }
              if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
                lVar9 = 0;
                do {
                  *(float *)((long)*pauVar17 + lVar9 * 4) =
                       *(float *)((long)*pauVar17 + lVar9 * 4) * pfVar13[lVar9];
                  lVar9 = lVar9 + 1;
                } while (uVar11 - uVar21 != (int)lVar9);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar22);
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) == 1) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)pp_Var5[-3]) == 0) {
        if (0 < (int)uVar4) {
          uVar12 = 0;
          do {
            pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
            pfVar15 = (float *)(pMVar10[1].cstep * uVar12 * pMVar10[1].elemsize +
                               (long)pMVar10[1].data);
            pauVar17 = (undefined1 (*) [32])
                       (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar11 < 8) {
              uVar21 = 0;
            }
            else {
              iVar20 = 7;
              do {
                auVar30._0_4_ = *pfVar15 + *pfVar13;
                auVar30._4_4_ = pfVar15[1] + pfVar13[1];
                auVar30._8_4_ = pfVar15[2] + pfVar13[2];
                auVar30._12_4_ = pfVar15[3] + pfVar13[3];
                auVar30._16_4_ = pfVar15[4] + pfVar13[4];
                auVar30._20_4_ = pfVar15[5] + pfVar13[5];
                auVar30._24_4_ = pfVar15[6] + pfVar13[6];
                auVar30._28_4_ = pfVar15[7] + pfVar13[7];
                *pauVar17 = auVar30;
                pfVar13 = pfVar13 + 8;
                pfVar15 = pfVar15 + 8;
                pauVar17 = pauVar17 + 1;
                iVar20 = iVar20 + 8;
                uVar21 = uVar11 & 0xfffffff8;
              } while (iVar20 < (int)uVar11);
            }
            uVar8 = uVar21 | 3;
            while ((int)uVar8 < (int)uVar11) {
              auVar27._0_4_ = *pfVar15 + *pfVar13;
              auVar27._4_4_ = pfVar15[1] + pfVar13[1];
              auVar27._8_4_ = pfVar15[2] + pfVar13[2];
              auVar27._12_4_ = pfVar15[3] + pfVar13[3];
              *(undefined1 (*) [16])*pauVar17 = auVar27;
              pfVar13 = pfVar13 + 4;
              pfVar15 = pfVar15 + 4;
              pauVar17 = (undefined1 (*) [32])((long)*pauVar17 + 0x10);
              uVar8 = uVar21 + 7;
              uVar21 = uVar21 + 4;
            }
            if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
              lVar9 = 0;
              do {
                *(float *)((long)*pauVar17 + lVar9 * 4) = pfVar15[lVar9] + pfVar13[lVar9];
                lVar9 = lVar9 + 1;
              } while (uVar11 - uVar21 != (int)lVar9);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar22);
          pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7)) {
          uVar12 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar10 = pMVar10 + uVar12;
              uVar16 = 0;
              do {
                pfVar13 = (float *)(pMVar10->cstep * uVar16 * pMVar10->elemsize +
                                   (long)pMVar10->data);
                pauVar17 = (undefined1 (*) [32])
                           (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
                uVar21 = 0;
                if (7 < (int)uVar11) {
                  iVar20 = 7;
                  do {
                    auVar31._0_4_ = *pfVar13 + *(float *)*pauVar17;
                    auVar31._4_4_ = pfVar13[1] + *(float *)((long)*pauVar17 + 4);
                    auVar31._8_4_ = pfVar13[2] + *(float *)((long)*pauVar17 + 8);
                    auVar31._12_4_ = pfVar13[3] + *(float *)((long)*pauVar17 + 0xc);
                    auVar31._16_4_ = pfVar13[4] + *(float *)((long)*pauVar17 + 0x10);
                    auVar31._20_4_ = pfVar13[5] + *(float *)((long)*pauVar17 + 0x14);
                    auVar31._24_4_ = pfVar13[6] + *(float *)((long)*pauVar17 + 0x18);
                    auVar31._28_4_ = pfVar13[7] + *(float *)((long)*pauVar17 + 0x1c);
                    *pauVar17 = auVar31;
                    pfVar13 = pfVar13 + 8;
                    pauVar17 = pauVar17 + 1;
                    iVar20 = iVar20 + 8;
                    uVar21 = uVar11 & 0xfffffff8;
                  } while (iVar20 < (int)uVar11);
                }
                uVar8 = uVar21 | 3;
                while ((int)uVar8 < (int)uVar11) {
                  auVar28._0_4_ = *pfVar13 + *(float *)*pauVar17;
                  auVar28._4_4_ = pfVar13[1] + *(float *)((long)*pauVar17 + 4);
                  auVar28._8_4_ = pfVar13[2] + *(float *)((long)*pauVar17 + 8);
                  auVar28._12_4_ = pfVar13[3] + *(float *)((long)*pauVar17 + 0xc);
                  *(undefined1 (*) [16])*pauVar17 = auVar28;
                  pfVar13 = pfVar13 + 4;
                  pauVar17 = (undefined1 (*) [32])((long)*pauVar17 + 0x10);
                  uVar8 = uVar21 + 7;
                  uVar21 = uVar21 + 4;
                }
                if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
                  lVar9 = 0;
                  do {
                    *(float *)((long)*pauVar17 + lVar9 * 4) =
                         *(float *)((long)*pauVar17 + lVar9 * 4) + pfVar13[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (uVar11 - uVar21 != (int)lVar9);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar22);
              pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar4) {
          uVar12 = 0;
          do {
            pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
            pauVar17 = (undefined1 (*) [32])
                       (pMVar10[1].cstep * uVar12 * pMVar10[1].elemsize + (long)pMVar10[1].data);
            pauVar18 = (undefined1 (*) [32])
                       (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
            fVar1 = **(float **)(&this->field_0xd8 + (long)pp_Var5[-3]);
            auVar25._4_4_ = fVar1;
            auVar25._0_4_ = fVar1;
            auVar25._8_4_ = fVar1;
            auVar25._12_4_ = fVar1;
            fVar2 = (*(float **)(&this->field_0xd8 + (long)pp_Var5[-3]))[1];
            auVar32._4_4_ = fVar2;
            auVar32._0_4_ = fVar2;
            auVar32._8_4_ = fVar2;
            auVar32._12_4_ = fVar2;
            auVar33._16_4_ = fVar2;
            auVar33._0_16_ = auVar32;
            auVar33._20_4_ = fVar2;
            auVar33._24_4_ = fVar2;
            auVar33._28_4_ = fVar2;
            if ((int)uVar11 < 8) {
              uVar21 = 0;
            }
            else {
              iVar20 = 7;
              do {
                auVar34._0_4_ = fVar1 * *pfVar13;
                auVar34._4_4_ = fVar1 * pfVar13[1];
                auVar34._8_4_ = fVar1 * pfVar13[2];
                auVar34._12_4_ = fVar1 * pfVar13[3];
                auVar34._16_4_ = fVar1 * pfVar13[4];
                auVar34._20_4_ = fVar1 * pfVar13[5];
                auVar34._28_36_ = in_ZMM2._28_36_;
                auVar34._24_4_ = fVar1 * pfVar13[6];
                auVar23 = vfmadd231ps_fma(auVar34._0_32_,auVar33,*pauVar17);
                in_ZMM2 = ZEXT1664(auVar23);
                *pauVar18 = ZEXT1632(auVar23);
                pfVar13 = pfVar13 + 8;
                pauVar17 = pauVar17 + 1;
                pauVar18 = pauVar18 + 1;
                iVar20 = iVar20 + 8;
                uVar21 = uVar11 & 0xfffffff8;
              } while (iVar20 < (int)uVar11);
            }
            if ((int)(uVar21 | 3) < (int)uVar11) {
              auVar23 = vshufps_avx(auVar25,auVar25,0);
              in_ZMM2 = ZEXT1664(auVar23);
              auVar24 = vshufps_avx(auVar32,auVar32,0);
              uVar8 = uVar21;
              do {
                auVar35._0_4_ = auVar23._0_4_ * *pfVar13;
                auVar35._4_4_ = auVar23._4_4_ * pfVar13[1];
                auVar35._8_4_ = auVar23._8_4_ * pfVar13[2];
                auVar35._12_4_ = auVar23._12_4_ * pfVar13[3];
                auVar27 = vfmadd231ps_fma(auVar35,auVar24,*(undefined1 (*) [16])*pauVar17);
                *(undefined1 (*) [16])*pauVar18 = auVar27;
                pfVar13 = pfVar13 + 4;
                pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                pauVar18 = (undefined1 (*) [32])((long)*pauVar18 + 0x10);
                uVar21 = uVar8 + 4;
                iVar20 = uVar8 + 7;
                uVar8 = uVar21;
              } while (iVar20 < (int)uVar11);
            }
            if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
              lVar9 = 0;
              do {
                auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar13[lVar9])),auVar32,
                                          ZEXT416(*(uint *)(*pauVar17 + lVar9 * 4)));
                in_ZMM2 = ZEXT1664(auVar23);
                *(int *)((long)*pauVar18 + lVar9 * 4) = auVar23._0_4_;
                lVar9 = lVar9 + 1;
              } while (uVar11 - uVar21 != (int)lVar9);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar22);
          pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7)) {
          pp_Var5 = this->_vptr_Eltwise_x86_fma;
          uVar12 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar10 = pMVar10 + uVar12;
              uVar16 = 0;
              do {
                pauVar17 = (undefined1 (*) [32])
                           (pMVar10->cstep * uVar16 * pMVar10->elemsize + (long)pMVar10->data);
                pauVar18 = (undefined1 (*) [32])
                           (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
                uVar3 = *(undefined4 *)
                         (*(long *)(&this->field_0xd8 + (long)pp_Var5[-3]) + uVar12 * 4);
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar29._16_4_ = uVar3;
                auVar29._0_16_ = auVar26;
                auVar29._20_4_ = uVar3;
                auVar29._24_4_ = uVar3;
                auVar29._28_4_ = uVar3;
                uVar21 = 0;
                if (7 < (int)uVar11) {
                  iVar20 = 7;
                  do {
                    auVar23 = vfmadd213ps_fma(*pauVar17,auVar29,*pauVar18);
                    *pauVar18 = ZEXT1632(auVar23);
                    pauVar17 = pauVar17 + 1;
                    pauVar18 = pauVar18 + 1;
                    iVar20 = iVar20 + 8;
                    uVar21 = uVar11 & 0xfffffff8;
                  } while (iVar20 < (int)uVar11);
                }
                if ((int)(uVar21 | 3) < (int)uVar11) {
                  auVar23 = vshufps_avx(auVar26,auVar26,0);
                  uVar8 = uVar21;
                  do {
                    auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar17,auVar23,
                                              *(undefined1 (*) [16])*pauVar18);
                    *(undefined1 (*) [16])*pauVar18 = auVar24;
                    pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                    pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                    uVar21 = uVar8 + 4;
                    iVar20 = uVar8 + 7;
                    uVar8 = uVar21;
                  } while (iVar20 < (int)uVar11);
                }
                if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
                  lVar9 = 0;
                  do {
                    auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar17 + lVar9 * 4)),auVar26,
                                              ZEXT416(*(uint *)(*pauVar18 + lVar9 * 4)));
                    *(int *)(*pauVar18 + lVar9 * 4) = auVar23._0_4_;
                    lVar9 = lVar9 + 1;
                  } while (uVar11 - uVar21 != (int)lVar9);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar22);
              pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar20 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_fma[-3]) == 2) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar4) {
        uVar12 = 0;
        do {
          pauVar17 = (undefined1 (*) [32])(m->cstep * uVar12 * m->elemsize + (long)m->data);
          pauVar18 = (undefined1 (*) [32])
                     (pMVar10[1].cstep * uVar12 * pMVar10[1].elemsize + (long)pMVar10[1].data);
          pauVar19 = (undefined1 (*) [32])
                     (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar11 < 8) {
            uVar21 = 0;
          }
          else {
            iVar20 = 7;
            do {
              auVar6 = vmaxps_avx(*pauVar17,*pauVar18);
              *pauVar19 = auVar6;
              pauVar17 = pauVar17 + 1;
              pauVar18 = pauVar18 + 1;
              pauVar19 = pauVar19 + 1;
              iVar20 = iVar20 + 8;
              uVar21 = uVar11 & 0xfffffff8;
            } while (iVar20 < (int)uVar11);
          }
          uVar8 = uVar21 | 3;
          while ((int)uVar8 < (int)uVar11) {
            auVar23 = vmaxps_avx(*(undefined1 (*) [16])*pauVar17,*(undefined1 (*) [16])*pauVar18);
            *(undefined1 (*) [16])*pauVar19 = auVar23;
            pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            pauVar19 = (undefined1 (*) [32])((long)*pauVar19 + 0x10);
            uVar8 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
            lVar9 = 0;
            do {
              auVar23 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar18 + lVar9 * 4)),
                                   ZEXT416(*(uint *)(*pauVar17 + lVar9 * 4)));
              *(int *)((long)*pauVar19 + lVar9 * 4) = auVar23._0_4_;
              lVar9 = lVar9 + 1;
            } while (uVar11 - uVar21 != (int)lVar9);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar22);
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      iVar20 = 0;
      if (2 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7)) {
        uVar12 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar10 = pMVar10 + uVar12;
            uVar16 = 0;
            do {
              pauVar17 = (undefined1 (*) [32])
                         (pMVar10->cstep * uVar16 * pMVar10->elemsize + (long)pMVar10->data);
              pauVar18 = (undefined1 (*) [32])
                         (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
              uVar21 = 0;
              if (7 < (int)uVar11) {
                iVar20 = 7;
                do {
                  auVar6 = vmaxps_avx(*pauVar18,*pauVar17);
                  *pauVar18 = auVar6;
                  pauVar17 = pauVar17 + 1;
                  pauVar18 = pauVar18 + 1;
                  iVar20 = iVar20 + 8;
                  uVar21 = uVar11 & 0xfffffff8;
                } while (iVar20 < (int)uVar11);
              }
              uVar8 = uVar21 | 3;
              while ((int)uVar8 < (int)uVar11) {
                auVar23 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,*(undefined1 (*) [16])*pauVar17
                                    );
                *(undefined1 (*) [16])*pauVar18 = auVar23;
                pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
                pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                uVar8 = uVar21 + 7;
                uVar21 = uVar21 + 4;
              }
              if (uVar11 - uVar21 != 0 && (int)uVar21 <= (int)uVar11) {
                lVar9 = 0;
                do {
                  auVar23 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar18 + lVar9 * 4)),
                                       ZEXT416(*(uint *)(*pauVar17 + lVar9 * 4)));
                  *(int *)(*pauVar18 + lVar9 * 4) = auVar23._0_4_;
                  lVar9 = lVar9 + 1;
                } while (uVar11 - uVar21 != (int)lVar9);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar22);
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        iVar20 = 0;
      }
    }
  }
  return iVar20;
}

Assistant:

int Eltwise_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}